

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O3

double rotationMatrixFromContactsPositionKine(Vector3 *vLFootPos,Vector3 *vRFootPos,Matrix3 *R)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double local_c8;
  double local_b8;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_98;
  double local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  double local_40;
  Scalar local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  auVar7._0_8_ = (vLFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[0] -
                 (vRFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[0];
  auVar7._8_8_ = (vLFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[1] -
                 (vRFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                 .m_data.array[1];
  dVar1 = (vLFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[2] -
          (vRFootPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[2];
  dVar6 = dVar1 * dVar1 + auVar7._8_8_ * auVar7._8_8_ + auVar7._0_8_ * auVar7._0_8_;
  local_78 = SQRT(dVar6);
  uStack_70 = 0;
  if (9.999999999999999e-33 < dVar6) {
    auVar4._8_4_ = SUB84(local_78,0);
    auVar4._0_8_ = local_78;
    auVar4._12_4_ = (int)((ulong)local_78 >> 0x20);
    auVar7 = divpd(auVar7,auVar4);
  }
  else {
    auVar7 = ZEXT816(0);
  }
  local_68 = -(ulong)(9.999999999999999e-33 < dVar6);
  uStack_60 = 0;
  dVar1 = (double)(~local_68 & 0x3ff0000000000000 | (ulong)(dVar1 / local_78) & local_68);
  atan2(auVar7._8_8_,dVar1);
  local_b8 = auVar7._0_8_;
  dVar1 = atan2(local_b8,dVar1);
  dVar6 = atan2(local_b8,auVar7._8_8_);
  dVar2 = cos(dVar1);
  dVar3 = cos(dVar6);
  local_98.m_row = 0;
  local_98.m_col = 1;
  local_98.m_currentBlockRows = 1;
  (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       dVar3 * dVar2;
  local_98.m_xpr = R;
  local_c8 = cos(dVar1);
  local_c8 = -local_c8;
  local_18 = sin(dVar6);
  local_18 = local_18 * local_c8;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_98,&local_18);
  local_20 = sin(dVar1);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_20);
  local_28 = sin(dVar6);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_28);
  local_30 = cos(dVar6);
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_30);
  local_38 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_38);
  local_c8 = sin(dVar1);
  local_c8 = -local_c8;
  local_40 = cos(dVar6);
  local_40 = local_40 * local_c8;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_40);
  dVar2 = sin(dVar1);
  local_48 = sin(dVar6);
  local_48 = local_48 * dVar2;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar5,&local_48);
  local_50 = cos(dVar1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar5,&local_50);
  if ((local_98.m_currentBlockRows + local_98.m_row == 3) && (local_98.m_col == 3)) {
    return (double)(local_68 & (ulong)local_78);
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
               );
}

Assistant:

double rotationMatrixFromContactsPositionKine(const Vector3 vLFootPos, const Vector3 vRFootPos, Matrix3& R )
{
Vector3 Vrl, axis, theta;
AngleAxis j;
double h, thetax, thetay, thetaz;
// Definition of the length and the unit vector between the two foots.
Vrl=vLFootPos-vRFootPos;
j=kine::rotationVectorToAngleAxis(Vrl);
h = j.angle(); // length between the ankles
axis = j.axis(); // unit vector between the ankles
//Definition of the transformation (rotation) between (x,y,z) and (perpendicular of j, j, z).
thetax=atan2(axis[1],axis[2]);
//theta=theta(0,0,atan(axis[0]/axis[1]));
thetay = atan2(axis[0],axis[2]);//theta[1];
thetaz = atan2(axis[0],axis[1]);//theta[2];
R << cos(thetay)*cos(thetaz), -cos(thetay)*sin(thetaz), sin(thetay),
sin(thetaz), cos(thetaz), 0,
-sin(thetay)*cos(thetaz), sin(thetay)*sin(thetaz), cos(thetay);
return h;
}